

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Screen.cpp
# Opt level: O2

void __thiscall Screen::Screen(Screen *this)

{
  int iVar1;
  int iVar2;
  WINDOW *pWVar3;
  
  (this->currentRoom)._M_dataplus._M_p = (pointer)&(this->currentRoom).field_2;
  (this->currentRoom)._M_string_length = 0;
  (this->currentRoom).field_2._M_local_buf[0] = '\0';
  (this->score)._M_dataplus._M_p = (pointer)&(this->score).field_2;
  (this->score)._M_string_length = 0;
  (this->score).field_2._M_local_buf[0] = '\0';
  (this->currentText)._M_dataplus._M_p = (pointer)&(this->currentText).field_2;
  (this->currentText)._M_string_length = 0;
  (this->currentText).field_2._M_local_buf[0] = '\0';
  (this->textFragments).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->textFragments).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->textFragments).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this->cursor[0] = 0;
  this->cursor[1] = 0;
  std::__cxx11::string::assign((char *)&this->score);
  std::__cxx11::string::assign((char *)&this->currentRoom);
  this->currentFragment = 0;
  this->colorCounter = 0;
  initscr();
  refresh();
  start_color();
  initializeScreenSize(this);
  iVar1 = getScreenSizeX(this);
  pWVar3 = (WINDOW *)newwin(3,iVar1,0,0);
  this->infoScreen = pWVar3;
  iVar1 = getScreenSizeY(this);
  iVar2 = getScreenSizeX(this);
  pWVar3 = (WINDOW *)newwin(iVar1 + -6,iVar2 + -2,3,1);
  this->textScreen = pWVar3;
  iVar1 = getScreenSizeX(this);
  iVar2 = getScreenSizeY(this);
  pWVar3 = (WINDOW *)newwin(3,iVar1,iVar2 + -3,0);
  this->inputScreen = pWVar3;
  this->animationMode = false;
  return;
}

Assistant:

Screen::Screen() {
    // Set the default values for all private methods
    cursor[0] = 0;  // Y
    cursor[1] = 0;  // X
    score = "0";
    currentRoom = " ";
    colorCounter = 0;
    currentFragment = 0;

    // Initialize the ncurses screen
    initscr();
    // raw();
    refresh();
    start_color();

    // Get the current size of the screen
    initializeScreenSize();

    // Create the windows for the program
    infoScreen = newwin(3, getScreenSizeX(), 0, 0);
    textScreen = newwin((getScreenSizeY() - 6), getScreenSizeX() - 2, 3, 1);
    inputScreen = newwin(3, getScreenSizeX(), (getScreenSizeY() - 3), 0);

    // Turn off animation mode
    animationMode = false;
}